

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Image * __thiscall
Image::transformLinear(Image *__return_storage_ptr__,Image *this,int s_min,int s_max)

{
  long lVar1;
  Image *image;
  Image *pIVar2;
  undefined4 in_register_00000014;
  void *in_R8;
  undefined8 uStack_a0;
  int aiStack_98 [2];
  long local_90;
  Image *local_88;
  Image *local_80;
  Image *local_78;
  int local_5c;
  int local_58;
  int j_1;
  int i_2;
  int i_1;
  unsigned_long __vla_expr0;
  undefined1 local_40 [8];
  Image result;
  int j;
  int i;
  int s_max_local;
  int s_min_local;
  Image *this_local;
  
  if ((s_min < 0) || (pIVar2 = (Image *)(ulong)(uint)s_max, j = s_max, i = s_min, s_max < 0)) {
    i = this->maxGray;
    j = 0;
    for (result.matrix._4_4_ = 0; pIVar2 = this, result.matrix._4_4_ < this->row;
        result.matrix._4_4_ = result.matrix._4_4_ + 1) {
      for (result.matrix._0_4_ = 0; (int)result.matrix < this->col;
          result.matrix._0_4_ = (int)result.matrix + 1) {
        if (j < this->matrix[result.matrix._4_4_][(int)result.matrix]) {
          j = this->matrix[result.matrix._4_4_][(int)result.matrix];
        }
        if (this->matrix[result.matrix._4_4_][(int)result.matrix] < i) {
          i = this->matrix[result.matrix._4_4_][(int)result.matrix];
        }
      }
    }
  }
  uStack_a0 = 0x103d81;
  local_88 = __return_storage_ptr__;
  local_80 = __return_storage_ptr__;
  local_78 = this;
  clone((Image *)local_40,(__fn *)this,(void *)CONCAT44(in_register_00000014,s_min),(int)pIVar2,
        in_R8);
  _i_2 = (ulong)(local_78->maxGray + 1);
  lVar1 = -(_i_2 * 4 + 0xf & 0xfffffffffffffff0);
  local_90 = (long)aiStack_98 + lVar1;
  for (j_1 = 0; j_1 <= local_78->maxGray; j_1 = j_1 + 1) {
    *(int *)(local_90 + (long)j_1 * 4) = (local_78->maxGray * (j_1 - i)) / (j - i);
  }
  for (local_58 = 0; local_58 < local_78->row; local_58 = local_58 + 1) {
    for (local_5c = 0; local_5c < local_78->col; local_5c = local_5c + 1) {
      *(undefined4 *)(*(long *)(result._8_8_ + (long)local_58 * 8) + (long)local_5c * 4) =
           *(undefined4 *)(local_90 + (long)local_78->matrix[local_58][local_5c] * 4);
    }
  }
  __vla_expr0 = (unsigned_long)aiStack_98;
  *(undefined8 *)((long)aiStack_98 + lVar1 + -8) = 0x103e73;
  image = normalize((Image *)local_40);
  pIVar2 = local_88;
  *(undefined8 *)((long)aiStack_98 + lVar1 + -8) = 0x103e7f;
  Image(pIVar2,image);
  *(undefined8 *)(__vla_expr0 - 8) = 0x103e91;
  ~Image((Image *)local_40);
  return local_80;
}

Assistant:

Image Image::transformLinear(int s_min, int s_max)
{
    if(s_min < 0 || s_max < 0)
    {
        s_min=maxGray, s_max=0;
        for (int i = 0; i < row; ++i) {
            for (int j = 0; j < col; ++j) {
                if(matrix[i][j] > s_max)
                    s_max = matrix[i][j];
                if(matrix[i][j] < s_min)
                    s_min = matrix[i][j];
            }
        }
    }

    Image result = clone();
    int LUT[maxGray+1];

    for(int i=0; i<=maxGray; ++i)
    {
        LUT[i] = maxGray*(i - s_min)/(s_max - s_min);
    }

    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            result.matrix[i][j] = LUT[matrix[i][j]];
        }
    }

    return result.normalize();
}